

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binding-hash.cc
# Opt level: O2

void __thiscall
wabt::BindingHash::SortDuplicatesVectorByLocation(BindingHash *this,ValueTypeVector *duplicates)

{
  pointer pppVar1;
  pointer pppVar2;
  long lVar3;
  ulong uVar4;
  __normal_iterator<const_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_wabt::Binding>_**,_std::vector<const_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_wabt::Binding>_*,_std::allocator<const_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_wabt::Binding>_*>_>_>
  __i;
  pointer pppVar5;
  
  pppVar1 = (duplicates->
            super__Vector_base<const_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_wabt::Binding>_*,_std::allocator<const_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_wabt::Binding>_*>_>
            )._M_impl.super__Vector_impl_data._M_start;
  pppVar2 = (duplicates->
            super__Vector_base<const_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_wabt::Binding>_*,_std::allocator<const_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_wabt::Binding>_*>_>
            )._M_impl.super__Vector_impl_data._M_finish;
  if (pppVar1 != pppVar2) {
    uVar4 = (long)pppVar2 - (long)pppVar1 >> 3;
    lVar3 = 0x3f;
    if (uVar4 != 0) {
      for (; uVar4 >> lVar3 == 0; lVar3 = lVar3 + -1) {
      }
    }
    std::
    __introsort_loop<__gnu_cxx::__normal_iterator<std::pair<std::__cxx11::string_const,wabt::Binding>const**,std::vector<std::pair<std::__cxx11::string_const,wabt::Binding>const*,std::allocator<std::pair<std::__cxx11::string_const,wabt::Binding>const*>>>,long,__gnu_cxx::__ops::_Iter_comp_iter<wabt::BindingHash::SortDuplicatesVectorByLocation(std::vector<std::pair<std::__cxx11::string_const,wabt::Binding>const*,std::allocator<std::pair<std::__cxx11::string_const,wabt::Binding>const*>>*)const::__0>>
              (pppVar1,pppVar2,((uint)lVar3 ^ 0x3f) * 2 ^ 0x7e);
    if ((long)pppVar2 - (long)pppVar1 < 0x81) {
      std::
      __insertion_sort<__gnu_cxx::__normal_iterator<std::pair<std::__cxx11::string_const,wabt::Binding>const**,std::vector<std::pair<std::__cxx11::string_const,wabt::Binding>const*,std::allocator<std::pair<std::__cxx11::string_const,wabt::Binding>const*>>>,__gnu_cxx::__ops::_Iter_comp_iter<wabt::BindingHash::SortDuplicatesVectorByLocation(std::vector<std::pair<std::__cxx11::string_const,wabt::Binding>const*,std::allocator<std::pair<std::__cxx11::string_const,wabt::Binding>const*>>*)const::__0>>
                (pppVar1,pppVar2);
      return;
    }
    pppVar5 = pppVar1 + 0x10;
    std::
    __insertion_sort<__gnu_cxx::__normal_iterator<std::pair<std::__cxx11::string_const,wabt::Binding>const**,std::vector<std::pair<std::__cxx11::string_const,wabt::Binding>const*,std::allocator<std::pair<std::__cxx11::string_const,wabt::Binding>const*>>>,__gnu_cxx::__ops::_Iter_comp_iter<wabt::BindingHash::SortDuplicatesVectorByLocation(std::vector<std::pair<std::__cxx11::string_const,wabt::Binding>const*,std::allocator<std::pair<std::__cxx11::string_const,wabt::Binding>const*>>*)const::__0>>
              (pppVar1,pppVar5);
    for (; pppVar5 != pppVar2; pppVar5 = pppVar5 + 1) {
      std::
      __unguarded_linear_insert<__gnu_cxx::__normal_iterator<std::pair<std::__cxx11::string_const,wabt::Binding>const**,std::vector<std::pair<std::__cxx11::string_const,wabt::Binding>const*,std::allocator<std::pair<std::__cxx11::string_const,wabt::Binding>const*>>>,__gnu_cxx::__ops::_Val_comp_iter<wabt::BindingHash::SortDuplicatesVectorByLocation(std::vector<std::pair<std::__cxx11::string_const,wabt::Binding>const*,std::allocator<std::pair<std::__cxx11::string_const,wabt::Binding>const*>>*)const::__0>>
                (pppVar5);
    }
  }
  return;
}

Assistant:

void BindingHash::SortDuplicatesVectorByLocation(
    ValueTypeVector* duplicates) const {
  std::sort(
      duplicates->begin(), duplicates->end(),
      [](const value_type* lhs, const value_type* rhs) -> bool {
        return lhs->second.loc.line < rhs->second.loc.line ||
               (lhs->second.loc.line == rhs->second.loc.line &&
                lhs->second.loc.first_column < rhs->second.loc.first_column);
      });
}